

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MLMatcher.cpp
# Opt level: O2

void __thiscall Kernel::MLMatcher::Impl::Impl(Impl *this)

{
  Lib::DArray<Kernel::Literal_*>::DArray(&this->s_baseLits,0x20);
  Lib::DArray<const_Lib::List<Kernel::Literal_*>_*>::DArray(&this->s_altsArr,0x20);
  Lib::DArray<unsigned_int>::DArray(&this->s_varCnts,0x20);
  Lib::DArray<unsigned_int_*>::DArray(&this->s_boundVarNums,0x20);
  Lib::DArray<Kernel::TermList_**>::DArray(&this->s_altPtrs,0x20);
  Lib::TriangularArray<unsigned_int>::TriangularArray(&this->s_remaining,0x20);
  Lib::TriangularArray<std::pair<int,_int>_*>::TriangularArray(&this->s_intersections,0x20);
  Lib::DArray<unsigned_int>::DArray(&this->s_nextAlts,0x20);
  Lib::DArray<unsigned_int>::DArray(&this->s_boundVarNumData,0x40);
  Lib::DArray<Kernel::TermList_*>::DArray(&this->s_altBindingPtrs,0x80);
  Lib::DArray<Kernel::TermList>::DArray(&this->s_altBindingsData,0x100);
  Lib::DArray<std::pair<int,_int>_>::DArray(&this->s_intersectionData,0x80);
  Lib::DArray<unsigned_int>::DArray(&this->s_matchRecord,0x20);
  (this->stats).numDecisions = 0;
  (this->stats).result = false;
  return;
}

Assistant:

MLMatcher::Impl::Impl()
  : s_baseLits(32)
  , s_altsArr(32)
  , s_varCnts(32)
  , s_boundVarNums(32)
  , s_altPtrs(32)
  , s_remaining(32)
  , s_intersections(32)
  , s_nextAlts(32)
  , s_boundVarNumData(64)
  , s_altBindingPtrs(128)
  , s_altBindingsData(256)
  , s_intersectionData(128)
  , s_matchRecord(32)
{ }